

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShaderPT_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int stagept)

{
  undefined1 local_198 [8];
  ostringstream os;
  int stagept_local;
  AdvancedUnsizedArrayLength2 *this_local;
  
  os._372_4_ = stagept;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (os._372_4_ == 0) {
    std::operator<<((ostream *)local_198,"\nvoid main() {\n  gl_Position = vec4(0,0,0,1);");
  }
  if (os._372_4_ == 1) {
    std::operator<<((ostream *)local_198,
                    "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);"
                   );
  }
  std::operator<<((ostream *)local_198,"\n}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string BuildShaderPT(int stagept)
	{
		std::ostringstream os;
		if (stagept == vertex)
		{
			os << NL "void main() {" NL "  gl_Position = vec4(0,0,0,1);";
		}
		if (stagept == fragment)
		{
			os << NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
					 "  o_color = vec4(0.0, 1.0, 0.0, 1.0);";
		}
		os << NL "}";
		return os.str();
	}